

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::Comment(cmXMLWriter *this,char *comment)

{
  ostream *poVar1;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  poVar1 = std::operator<<(this->Output,"<!-- ");
  poVar1 = std::operator<<(poVar1,comment);
  std::operator<<(poVar1," -->");
  return;
}

Assistant:

void cmXMLWriter::Comment(const char* comment)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << "<!-- " << comment << " -->";
}